

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

uint __thiscall Future<void>::Private::ThreadPool::ThreadContext::proc(ThreadContext *this)

{
  usize *puVar1;
  ThreadPool *pTVar2;
  bool bVar3;
  Job *__stat_loc;
  Job job;
  Job local_38;
  
  pTVar2 = this->_pool;
  do {
    while( true ) {
      bVar3 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop(&pTVar2->_queue,&local_38);
      if (!bVar3) break;
LAB_0011670f:
      FastSignal::set(&pTVar2->_dequeuedSignal);
      if (local_38.proc == (_func_void_void_ptr *)0x0) {
        this->_terminated = true;
        return 0;
      }
      (*local_38.proc)(local_38.args);
      LOCK();
      puVar1 = &this->_pool->_processedJobs;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
    }
    FastSignal::reset(&pTVar2->_enqueuedSignal);
    __stat_loc = &local_38;
    bVar3 = LockFreeQueue<Future<void>::Private::ThreadPool::Job>::pop(&pTVar2->_queue,&local_38);
    if (bVar3) goto LAB_0011670f;
    FastSignal::wait(&pTVar2->_enqueuedSignal,__stat_loc);
  } while( true );
}

Assistant:

uint proc()
      {
        Job job;
        LockFreeQueue<Job> &queue = _pool->_queue;
        FastSignal &enqueuedSignal = _pool->_enqueuedSignal;
        FastSignal &dequeuedSignal = _pool->_dequeuedSignal;
        for (;;)
        {
          while (!queue.pop(job))
          {
            enqueuedSignal.reset();
            if (queue.pop(job))
              break;
            enqueuedSignal.wait();
          }
          dequeuedSignal.set();
          if (job.proc)
          {
            job.proc(job.args);
            Atomic::increment(_pool->_processedJobs);
          }
          else
            break;
        }
        _terminated = true;
        return 0;
      }